

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::cEnqueue(SAT *this,Lit p,Reason r)

{
  lbool lVar1;
  bool bVar2;
  char cVar3;
  uint index;
  int iVar4;
  Clause CVar5;
  Lit *pLVar6;
  char *pcVar7;
  int *piVar8;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar9;
  uchar *in_RCX;
  anon_union_8_2_743a5d44_for_Reason_0 in_RDX;
  size_t *siglen;
  Lit in_ESI;
  uchar *sig;
  Clause *in_RDI;
  size_t in_R8;
  int v;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Lit in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffdc;
  Lit p_00;
  anon_union_8_2_743a5d44_for_Reason_0 local_10;
  uint local_4;
  
  local_10 = in_RDX;
  local_4 = in_ESI.x;
  index = ::var(in_ESI);
  lVar1 = value((SAT *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                in_stack_ffffffffffffffb0);
  p_00.x = CONCAT13(lVar1.value,(int3)in_stack_ffffffffffffffdc);
  sig = (uchar *)(ulong)(byte)::l_False.value;
  lVar1 = ::l_False;
  bVar2 = lbool::operator==((lbool *)&stack0xffffffffffffffdf,::l_False);
  if (bVar2) {
    if ((so.lazy & 1U) == 0) {
      setConfl((SAT *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (Lit)(int)((ulong)in_RDI >> 0x20),(Lit)(int)in_RDI);
    }
    else {
      Reason::Reason((Reason *)&stack0xffffffffffffffc8,(Clause *)0x0);
      bVar2 = Reason::operator==((Reason *)&local_10,(Reason)in_stack_ffffffffffffffc8);
      if (bVar2) {
        setConfl((SAT *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (Lit)(int)((ulong)in_RDI >> 0x20),(Lit)(int)in_RDI);
      }
      else {
        CVar5 = (Clause)getConfl((SAT *)CONCAT17(lVar1.value,in_stack_ffffffffffffffd0),
                                 (Reason *)in_stack_ffffffffffffffc8._pt,p_00);
        in_RDI[0x1e] = CVar5;
        pLVar6 = Clause::operator[](in_RDI,in_stack_ffffffffffffff9c);
        pLVar6->x = local_4;
      }
    }
  }
  else {
    iVar4 = sign((EVP_PKEY_CTX *)(ulong)local_4,sig,siglen,in_RCX,in_R8);
    lbool::lbool((lbool *)&stack0xffffffffffffffb3,(bool)(((byte)iVar4 ^ 0xff) & 1));
    iVar4 = toInt((lbool)0x0);
    cVar3 = (char)iVar4;
    pcVar7 = vec<signed_char>::operator[]((vec<signed_char> *)(in_RDI + 10),index);
    *pcVar7 = cVar3;
    iVar4 = Engine::trailPos((Engine *)0x292969);
    piVar8 = vec<int>::operator[]((vec<int> *)(in_RDI + 0xe),index);
    *piVar8 = iVar4;
    paVar9 = &vec<Reason>::operator[]((vec<Reason> *)(in_RDI + 0xc),index)->field_0;
    *paVar9 = local_10;
    vec<vec<Lit>_>::last((vec<vec<Lit>_> *)(in_RDI + 0x18));
    vec<Lit>::push((vec<Lit> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0.x),
                   (Lit *)CONCAT44(local_4,in_stack_ffffffffffffffa8));
  }
  return;
}

Assistant:

void SAT::cEnqueue(Lit p, Reason r) {
	/* if (so.debug) { */
	/*   std::cerr << "c-enqueue literal " << getLitString(toInt(p)) << " because " << showReason(r)
	 * << "\n"; */
	/* } */
	assert(value(p) != l_True);
	const int v = var(p);
	if (value(p) == l_False) {
		if (so.lazy) {
			if (r == nullptr) {
				assert(decisionLevel() == 0);
				setConfl();
			} else {
				confl = getConfl(r, p);
				(*confl)[0] = p;
			}
		} else {
			setConfl();
		}
		return;
	}
	assigns[v] = toInt(lbool(!sign(p)));
	trailpos[v] = engine.trailPos();
	reason[v] = r;
	trail.last().push(p);
}